

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_globalz_set_table_gej
               (size_t len,secp256k1_ge *r,secp256k1_fe *globalz,secp256k1_gej *a,secp256k1_fe *zr)

{
  undefined1 local_60 [8];
  secp256k1_fe zs;
  size_t i;
  secp256k1_fe *zr_local;
  secp256k1_gej *a_local;
  secp256k1_fe *globalz_local;
  secp256k1_ge *r_local;
  size_t len_local;
  
  zs.n[4] = len - 1;
  if (len != 0) {
    memcpy(r + zs.n[4],a + zs.n[4],0x28);
    memcpy(&r[zs.n[4]].y,&a[zs.n[4]].y,0x28);
    secp256k1_fe_normalize_weak(&r[zs.n[4]].y);
    memcpy(globalz,&a[zs.n[4]].z,0x28);
    r[zs.n[4]].infinity = 0;
    memcpy(local_60,zr + zs.n[4],0x28);
    while (zs.n[4] != 0) {
      if (zs.n[4] != len - 1) {
        secp256k1_fe_mul((secp256k1_fe *)local_60,(secp256k1_fe *)local_60,zr + zs.n[4]);
      }
      zs.n[4] = zs.n[4] - 1;
      secp256k1_ge_set_gej_zinv(r + zs.n[4],a + zs.n[4],(secp256k1_fe *)local_60);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_globalz_set_table_gej(size_t len, secp256k1_ge *r, secp256k1_fe *globalz, const secp256k1_gej *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* The z of the final point gives us the "global Z" for the table. */
        r[i].x = a[i].x;
        r[i].y = a[i].y;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&r[i].y);
        *globalz = a[i].z;
        r[i].infinity = 0;
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &zs);
        }
    }
}